

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void exprSetHeight(Expr *p)

{
  int local_14;
  Expr *pEStack_10;
  int nHeight;
  Expr *p_local;
  
  local_14 = 0;
  pEStack_10 = p;
  heightOfExpr(p->pLeft,&local_14);
  heightOfExpr(pEStack_10->pRight,&local_14);
  if ((pEStack_10->flags & 0x800) == 0x800) {
    heightOfSelect((pEStack_10->x).pSelect,&local_14);
  }
  else {
    heightOfExprList((pEStack_10->x).pList,&local_14);
  }
  pEStack_10->nHeight = local_14 + 1;
  return;
}

Assistant:

static void exprSetHeight(Expr *p){
  int nHeight = 0;
  heightOfExpr(p->pLeft, &nHeight);
  heightOfExpr(p->pRight, &nHeight);
  if( ExprHasProperty(p, EP_xIsSelect) ){
    heightOfSelect(p->x.pSelect, &nHeight);
  }else{
    heightOfExprList(p->x.pList, &nHeight);
  }
  p->nHeight = nHeight + 1;
}